

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetCurrentFont(ImFont *font)

{
  float fVar1;
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  ImFontAtlas *pIVar4;
  float fVar5;
  
  pIVar3 = GImGui;
  if ((font != (ImFont *)0x0) && (pIVar4 = font->ContainerAtlas, pIVar4 != (ImFontAtlas *)0x0)) {
    fVar1 = font->Scale;
    fVar5 = 0.0;
    if (0.0 < fVar1) {
      GImGui->Font = font;
      auVar2 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),
                          ZEXT416((uint)(fVar1 * (pIVar3->IO).FontGlobalScale * font->FontSize)));
      pIVar3->FontBaseSize = auVar2._0_4_;
      if (pIVar3->CurrentWindow != (ImGuiWindow *)0x0) {
        fVar5 = ImGuiWindow::CalcFontSize(pIVar3->CurrentWindow);
        font = pIVar3->Font;
        pIVar4 = font->ContainerAtlas;
      }
      pIVar3->FontSize = fVar5;
      (pIVar3->DrawListSharedData).TexUvWhitePixel = pIVar4->TexUvWhitePixel;
      (pIVar3->DrawListSharedData).TexUvLines = pIVar4->TexUvLines;
      (pIVar3->DrawListSharedData).Font = font;
      (pIVar3->DrawListSharedData).FontSize = fVar5;
      return;
    }
    __assert_fail("font->Scale > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1917,"void ImGui::SetCurrentFont(ImFont *)");
  }
  __assert_fail("font && font->IsLoaded()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1916,"void ImGui::SetCurrentFont(ImFont *)");
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.TexUvLines = atlas->TexUvLines;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}